

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-util.cc
# Opt level: O0

void __thiscall wabt::ModuleContext::BeginFunc(ModuleContext *this,Func *func)

{
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  LabelType local_1c;
  Func *local_18;
  Func *func_local;
  ModuleContext *this_local;
  
  local_18 = func;
  func_local = (Func *)this;
  std::vector<wabt::Label,_std::allocator<wabt::Label>_>::clear(&this->label_stack_);
  local_1c = First;
  std::__cxx11::string::string((string *)&local_40);
  memset(&local_58,0,0x18);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_58);
  std::vector<wabt::Label,std::allocator<wabt::Label>>::
  emplace_back<wabt::LabelType,std::__cxx11::string,std::vector<wabt::Type,std::allocator<wabt::Type>>,std::vector<wabt::Type,std::allocator<wabt::Type>>const&>
            ((vector<wabt::Label,std::allocator<wabt::Label>> *)&this->label_stack_,&local_1c,
             &local_40,&local_58,&(local_18->decl).sig.result_types);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_58);
  std::__cxx11::string::~string((string *)&local_40);
  this->current_func_ = local_18;
  return;
}

Assistant:

void ModuleContext::BeginFunc(const Func& func) {
  label_stack_.clear();
  label_stack_.emplace_back(LabelType::Func, std::string(), TypeVector(),
                            func.decl.sig.result_types);
  current_func_ = &func;
}